

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plibraryloader_test.cpp
# Opt level: O2

pint p_test_case_plibraryloader_nomem_test(void)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  PMemVTable vtable;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  iVar1 = p_library_loader_is_ref_counted();
  if (iVar1 == 0) {
    p_libsys_shutdown();
    iVar1 = 0;
  }
  else {
    p_file_remove("./p_empty_file.txt",0);
    __stream = fopen("./p_empty_file.txt","w");
    if (__stream == (FILE *)0x0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plibraryloader_test.cpp"
             ,0x45);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    iVar1 = fclose(__stream);
    if (iVar1 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plibraryloader_test.cpp"
             ,0x46);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    iVar1 = p_mem_set_vtable();
    if (iVar1 != 1) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plibraryloader_test.cpp"
             ,0x4e);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    lVar2 = p_library_loader_new("./p_empty_file.txt");
    if (lVar2 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plibraryloader_test.cpp"
             ,0x54);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    lVar2 = p_library_loader_new(g_argv);
    if (lVar2 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plibraryloader_test.cpp"
             ,0x55);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    p_mem_restore_vtable();
    iVar1 = p_file_remove("./p_empty_file.txt",0);
    if (iVar1 != 1) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plibraryloader_test.cpp"
             ,0x5d);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    p_libsys_shutdown();
    iVar1 = -(uint)(p_test_module_fail_counter != 0);
  }
  return iVar1;
}

Assistant:

P_TEST_CASE_BEGIN (plibraryloader_nomem_test)
{
	p_libsys_init ();

	if (P_UNLIKELY (p_library_loader_is_ref_counted () == FALSE)) {
		p_libsys_shutdown ();
		P_TEST_CASE_RETURN ();
	}

	/* Cleanup from previous run */
	p_file_remove ("." P_DIR_SEPARATOR "p_empty_file.txt", NULL);

	FILE *file = fopen ("." P_DIR_SEPARATOR "p_empty_file.txt", "w");
	P_TEST_CHECK (file != NULL);
	P_TEST_CHECK (fclose (file) == 0);

	PMemVTable vtable;

	vtable.f_free    = pmem_free;
	vtable.f_malloc  = pmem_alloc;
	vtable.f_realloc = pmem_realloc;

	P_TEST_CHECK (p_mem_set_vtable (&vtable) == TRUE);

#ifdef P_OS_WIN
	SetErrorMode (SEM_FAILCRITICALERRORS);
#endif

	P_TEST_CHECK (p_library_loader_new ("." P_DIR_SEPARATOR "p_empty_file.txt") == NULL);
        P_TEST_CHECK (p_library_loader_new (g_argv) == NULL);

#ifdef P_OS_WIN
	SetErrorMode (0);
#endif

	p_mem_restore_vtable ();

	P_TEST_CHECK (p_file_remove ("." P_DIR_SEPARATOR "p_empty_file.txt", NULL) == TRUE);

	p_libsys_shutdown ();
}